

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tribench.c
# Opt level: O0

void paint(ATimeUs timestamp,float dt)

{
  AReFrame f;
  AMat4f a;
  AMat4f b;
  float fVar1;
  float fVar2;
  AVec3f AVar3;
  AQuat AVar4;
  undefined4 in_stack_fffffffffffffd94;
  float in_stack_fffffffffffffd98;
  undefined1 auVar5 [12];
  undefined4 in_stack_fffffffffffffdf8;
  float in_stack_fffffffffffffdfc;
  uint local_1f0;
  uint i;
  uint split;
  AMat4f local_1b8;
  undefined1 local_178 [8];
  AMat4f vp4;
  AMat4f model4;
  AReFrame frame;
  undefined8 local_38;
  AVec3f lpos;
  AGLClearParams clear;
  float t;
  float dt_local;
  ATimeUs timestamp_local;
  
  fVar1 = (float)timestamp * 1e-06;
  fVar2 = sinf(fVar1 * 0.1);
  lpos.y = fVar2 * 0.0;
  fVar2 = sinf(fVar1 * 0.2);
  lpos.z = fVar2 * 0.0;
  sinf(fVar1 * 0.3);
  aGLClear((AGLClearParams *)&lpos.y,&g.target);
  AVar3 = aVec3f(1.0,0.0,0.0);
  lpos.x = AVar3.z;
  local_38 = AVar3._0_8_;
  g.pun[2].value.pf = (GLfloat *)&local_38;
  fVar2 = sinf(fVar1 * 0.37);
  AVar3 = aVec3f(fVar2 * 0.7,0.2,0.7);
  AVar3 = aVec3fNormalize(AVar3);
  AVar4 = aQuatRotation(AVar3,fVar1 * -0.4);
  AVar3 = aVec3f(0.0,0.0,0.0);
  frame.orient.v.z = AVar3.x;
  f.orient.v.z = frame.orient.v.z;
  f.orient.v.x = (float)(int)AVar4._8_8_;
  f.orient.v.y = (float)(int)((ulong)AVar4._8_8_ >> 0x20);
  f.orient.w = (float)(int)AVar3._4_8_;
  f.transl.x = (float)(int)((ulong)AVar3._4_8_ >> 0x20);
  f.transl.y = (float)in_stack_fffffffffffffd94;
  f.transl.z = in_stack_fffffffffffffd98;
  aMat4fReFrame(f);
  AVar3 = aVec3f(0.0,0.0,-10.0);
  aMat4fTranslation(&local_1b8,AVar3);
  auVar5 = g.projection.Z._4_12_;
  a.X.z = g.projection.Y.x;
  a.X.x = (float)(int)g.projection.X._8_8_;
  a.X.y = (float)(int)((ulong)g.projection.X._8_8_ >> 0x20);
  a.X.w = (float)(int)g.projection.Y._4_8_;
  a.Y.x = (float)(int)((ulong)g.projection.Y._4_8_ >> 0x20);
  a.Y.y = g.projection.Y.w;
  a.Y.z = g.projection.Z.x;
  a.Y.w = (float)auVar5._0_4_;
  a.Z.x = (float)auVar5._4_4_;
  a.Z.y = (float)auVar5._8_4_;
  a.Z.z = g.projection.W.x;
  a.Z.w = g.projection.W.y;
  a.W.x = g.projection.W.z;
  a.W.y = g.projection.W.w;
  a.W.z = local_1b8.X.x;
  a.W.w = local_1b8.X.y;
  b.X.z = local_1b8.Y.x;
  b.X.w = local_1b8.Y.y;
  b.X.x = local_1b8.X.z;
  b.X.y = local_1b8.X.w;
  b.Y.x = local_1b8.Y.z;
  b.Y.y = local_1b8.Y.w;
  b.Y.z = local_1b8.Z.x;
  b.Y.w = local_1b8.Z.y;
  b.Z.x = local_1b8.Z.z;
  b.Z.y = local_1b8.Z.w;
  b.Z.z = local_1b8.W.x;
  b.Z.w = local_1b8.W.y;
  b.W.x = local_1b8.W.z;
  b.W.y = local_1b8.W.w;
  b.W.z = (float)in_stack_fffffffffffffdf8;
  b.W.w = in_stack_fffffffffffffdfc;
  aMat4fMul(a,b);
  g.pun[1].value.pf = &vp4.W.z;
  g.pun[0].value.pf = (GLfloat *)local_178;
  for (local_1f0 = 0; local_1f0 < g.vertices_count / 0x6000; local_1f0 = local_1f0 + 1) {
    g.draw.primitive.first = local_1f0 * 0x6000;
    g.draw.primitive.count = 0x6000;
    aGLDraw(&g.draw,&g.merge,&g.target);
  }
  g.pun[1].value.pf = (GLfloat *)0x0;
  g.pun[0].value.pf = (GLfloat *)0x0;
  return;
}

Assistant:

static void paint(ATimeUs timestamp, float dt) {
	float t = timestamp * 1e-6f;
	AGLClearParams clear;
	(void)(dt);

	clear.a = 1;
	clear.r = .0f * sinf(t * .1f);
	clear.g = .0f * sinf(t * .2f);
	clear.b = .0f * sinf(t * .3f);
	clear.depth = 1;
	clear.bits = AGLCB_Everything;

	aGLClear(&clear, &g.target);

	struct AVec3f lpos = aVec3f(1, 0, 0);
	g.pun[VUniLightDir].value.pf = &lpos.x;

	struct AReFrame frame;
	frame.orient = aQuatRotation(aVec3fNormalize(aVec3f(.7f * sinf(t * .37f), .2f, .7f)), -t * .4f);
	// frame.orient = aQuatRotation(aVec3fNormalize(aVec3f(1, 1, .6)), t*.1f);
	frame.transl = aVec3f(0, 0, 0);

	struct AMat4f model4 = aMat4fReFrame(frame), vp4 = aMat4fMul(g.projection, aMat4fTranslation(aVec3f(0, 0, -10)));
	g.pun[VUniModel].value.pf = &model4.X.x;
	g.pun[VUniVP].value.pf = &vp4.X.x;

	const unsigned int split = 8192 * 3;
	for (unsigned int i = 0; i < g.vertices_count / split; ++i) {
		g.draw.primitive.first = split * i;
		g.draw.primitive.count = split;
		aGLDraw(&g.draw, &g.merge, &g.target);
	}

	g.pun[VUniModel].value.pf = NULL;
	g.pun[VUniVP].value.pf = NULL;
}